

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O0

uint64_t SipHashUint256Extra(uint64_t k0,uint64_t k1,uint256 *val,uint32_t extra)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  _If_is_unsigned_integer<unsigned_long> _Var5;
  _If_is_unsigned_integer<unsigned_long> _Var6;
  unsigned_long uVar7;
  _If_is_unsigned_integer<unsigned_long> _Var8;
  _If_is_unsigned_integer<unsigned_long> _Var9;
  unsigned_long uVar10;
  ulong uVar11;
  base_blob<256U> *pbVar12;
  uint64_t uVar13;
  uchar *puVar14;
  uint in_ECX;
  ulong in_RSI;
  ulong in_RDI;
  long in_FS_OFFSET;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint64_t d;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar15;
  base_blob<256U> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = base_blob<256U>::GetUint64
                    (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  uVar3 = in_RDI ^ 0x6c7967656e657261;
  uVar4 = in_RSI ^ 0x7465646279746573 ^ uVar2;
  iVar15 = (int)(uVar4 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar3,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar3,iVar15);
  uVar7 = uVar4 + uVar3;
  _Var8 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar3 = (uVar7 ^ _Var8) + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var8) >> 0x20));
  uVar4 = uVar3 ^ _Var6;
  uVar7 = ((in_RSI ^ 0x646f72616e646f6d) + (in_RDI ^ 0x736f6d6570736575) ^ _Var5) + uVar7;
  iVar15 = (int)(uVar4 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar10 = uVar4 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar10,iVar15);
  uVar4 = (uVar10 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar10,(int)((uVar10 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar10 = ((uVar7 ^ _Var5) + uVar3 ^ _Var8) + uVar10;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar10,iVar15);
  pbVar12 = (base_blob<256U> *)std::rotl<unsigned_long>(uVar10,iVar15);
  uVar13 = base_blob<256U>::GetUint64(pbVar12,iVar15);
  uVar11 = uVar13 ^ uVar11;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var6 = std::rotl<unsigned_long>((unsigned_long)pbVar12,iVar15);
  _Var8 = std::rotl<unsigned_long>((unsigned_long)pbVar12,iVar15);
  puVar14 = (pbVar12->m_data)._M_elems + uVar11;
  _Var9 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  uVar3 = ((ulong)puVar14 ^ _Var9) + _Var8;
  _Var8 = std::rotl<unsigned_long>((unsigned_long)puVar14,(int)(((ulong)puVar14 ^ _Var9) >> 0x20));
  uVar11 = uVar3 ^ _Var8;
  puVar14 = puVar14 + ((uVar10 ^ _Var5) + (uVar2 ^ uVar4) ^ _Var6);
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  _Var6 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar7 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar4 = (uVar7 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar7 = (((ulong)puVar14 ^ _Var5) + uVar3 ^ _Var8) + uVar7;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  pbVar12 = (base_blob<256U> *)std::rotl<unsigned_long>(uVar7,iVar15);
  uVar2 = base_blob<256U>::GetUint64(pbVar12,iVar15);
  uVar11 = uVar2 ^ uVar11;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var6 = std::rotl<unsigned_long>((unsigned_long)pbVar12,iVar15);
  _Var8 = std::rotl<unsigned_long>((unsigned_long)pbVar12,iVar15);
  puVar14 = (pbVar12->m_data)._M_elems + uVar11;
  _Var9 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  uVar3 = ((ulong)puVar14 ^ _Var9) + _Var8;
  _Var8 = std::rotl<unsigned_long>((unsigned_long)puVar14,(int)(((ulong)puVar14 ^ _Var9) >> 0x20));
  uVar11 = uVar3 ^ _Var8;
  puVar14 = puVar14 + ((uVar7 ^ _Var5) + (uVar13 ^ uVar4) ^ _Var6);
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  _Var6 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar7 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar4 = (uVar7 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar7 = (((ulong)puVar14 ^ _Var5) + uVar3 ^ _Var8) + uVar7;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  pbVar12 = (base_blob<256U> *)std::rotl<unsigned_long>(uVar7,iVar15);
  uVar13 = base_blob<256U>::GetUint64(pbVar12,iVar15);
  uVar11 = uVar13 ^ uVar11;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var6 = std::rotl<unsigned_long>((unsigned_long)pbVar12,iVar15);
  _Var8 = std::rotl<unsigned_long>((unsigned_long)pbVar12,iVar15);
  puVar14 = (pbVar12->m_data)._M_elems + uVar11;
  _Var9 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  uVar3 = ((ulong)puVar14 ^ _Var9) + _Var8;
  _Var8 = std::rotl<unsigned_long>((unsigned_long)puVar14,(int)(((ulong)puVar14 ^ _Var9) >> 0x20));
  uVar11 = uVar3 ^ _Var8;
  puVar14 = puVar14 + ((uVar7 ^ _Var5) + (uVar2 ^ uVar4) ^ _Var6);
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  _Var6 = std::rotl<unsigned_long>((unsigned_long)puVar14,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar7 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar4 = (uVar7 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar7 = (((ulong)puVar14 ^ _Var5) + uVar3 ^ _Var8) + uVar7;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar11 = ((ulong)in_ECX | 0x2400000000000000) ^ uVar11;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar10 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar10,iVar15);
  uVar3 = (uVar10 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar10,(int)((uVar10 ^ _Var6) >> 0x20));
  uVar11 = uVar3 ^ _Var6;
  uVar10 = ((uVar7 ^ _Var5) + (uVar13 ^ uVar4) ^ _Var8) + uVar10;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar10,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar10,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar7 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar4 = (uVar7 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar7 = ((uVar10 ^ _Var5) + uVar3 ^ _Var8) + uVar7;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar3 = _Var6 ^ 0xff;
  _Var6 = std::rotl<unsigned_long>(uVar3,iVar15);
  _Var8 = std::rotl<unsigned_long>(uVar3,iVar15);
  uVar10 = uVar11 + uVar3;
  _Var9 = std::rotl<unsigned_long>(uVar10,iVar15);
  uVar3 = (uVar10 ^ _Var9) + _Var8;
  _Var8 = std::rotl<unsigned_long>(uVar10,(int)((uVar10 ^ _Var9) >> 0x20));
  uVar11 = uVar3 ^ _Var8;
  uVar10 = ((uVar7 ^ _Var5) + (((ulong)in_ECX | 0x2400000000000000) ^ uVar4) ^ _Var6) + uVar10;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar10,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar10,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar7 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar4 = (uVar7 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar7 = ((uVar10 ^ _Var5) + uVar3 ^ _Var8) + uVar7;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar10 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar10,iVar15);
  uVar3 = (uVar10 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar10,(int)((uVar10 ^ _Var6) >> 0x20));
  uVar11 = uVar3 ^ _Var6;
  uVar10 = ((uVar7 ^ _Var5) + uVar4 ^ _Var8) + uVar10;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar10,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar10,iVar15);
  _Var8 = std::rotl<unsigned_long>(_Var6,iVar15);
  _Var9 = std::rotl<unsigned_long>(_Var6,iVar15);
  uVar7 = uVar11 + _Var6;
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  uVar4 = (uVar7 ^ _Var6) + _Var9;
  _Var6 = std::rotl<unsigned_long>(uVar7,(int)((uVar7 ^ _Var6) >> 0x20));
  uVar11 = uVar4 ^ _Var6;
  uVar7 = ((uVar10 ^ _Var5) + uVar3 ^ _Var8) + uVar7;
  iVar15 = (int)(uVar11 >> 0x20);
  _Var5 = std::rotl<unsigned_long>(uVar7,iVar15);
  _Var6 = std::rotl<unsigned_long>(uVar7,iVar15);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar4 ^ uVar7 ^ _Var5 ^ _Var6 ^ uVar11;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t SipHashUint256Extra(uint64_t k0, uint64_t k1, const uint256& val, uint32_t extra)
{
    /* Specialized implementation for efficiency */
    uint64_t d = val.GetUint64(0);

    uint64_t v0 = 0x736f6d6570736575ULL ^ k0;
    uint64_t v1 = 0x646f72616e646f6dULL ^ k1;
    uint64_t v2 = 0x6c7967656e657261ULL ^ k0;
    uint64_t v3 = 0x7465646279746573ULL ^ k1 ^ d;

    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(1);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(2);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(3);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = ((uint64_t{36}) << 56) | extra;
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    v2 ^= 0xFF;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    return v0 ^ v1 ^ v2 ^ v3;
}